

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t rar5_cleanup(archive_read *a)

{
  rar5 *rar_00;
  rar5 *rar;
  archive_read *a_local;
  
  rar_00 = get_context(a);
  free((rar_00->cstate).window_buf);
  free((rar_00->cstate).filtered_buf);
  free((rar_00->vol).push_buf);
  free_filters(rar_00);
  cdeque_free(&(rar_00->cstate).filters);
  free(rar_00);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int rar5_cleanup(struct archive_read *a) {
	struct rar5* rar = get_context(a);

	free(rar->cstate.window_buf);
	free(rar->cstate.filtered_buf);

	free(rar->vol.push_buf);

	free_filters(rar);
	cdeque_free(&rar->cstate.filters);

	free(rar);
	a->format->data = NULL;

	return ARCHIVE_OK;
}